

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O3

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_0::TypeMerging::mergeableSupertypesFirst
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          TypeMerging *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_30;
  code *local_18;
  
  local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18 = std::
             _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
             ::_M_invoke;
  local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
                ::_M_manager;
  local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  HeapTypeOrdering::supertypesFirst<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            (__return_storage_ptr__,(HeapTypeOrdering *)types,&local_30,
             (function<std::optional<wasm::HeapType>_(wasm::HeapType)> *)
             std::
             _Function_handler<std::optional<wasm::HeapType>_(wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp:149:14)>
             ::_M_manager);
  if ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
      local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0) {
    local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(*(code *)local_30.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)
                            (&local_30,&local_30,3);
  }
  return (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
         local_30.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
}

Assistant:

std::vector<HeapType>
  mergeableSupertypesFirst(const std::vector<HeapType>& types) {
    return HeapTypeOrdering::supertypesFirst(
      types, [&](HeapType type) -> std::optional<HeapType> {
        if (auto super = type.getDeclaredSuperType()) {
          return getMerged(*super);
        }
        return std::nullopt;
      });
  }